

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_binder.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::GroupBinder::BindSelectRef(BindResult *__return_storage_ptr__,GroupBinder *this,idx_t entry)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  pointer pBVar1;
  SelectNode *pSVar2;
  mapped_type mVar3;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_01;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  bool bVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ulong uVar7;
  undefined8 uVar8;
  char cVar9;
  iterator iVar10;
  BoundConstantExpression *this_02;
  reference pvVar11;
  pointer pPVar12;
  mapped_type *pmVar13;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var14;
  BinderException *this_03;
  ulong uVar15;
  char cVar16;
  __hashtable *__h;
  type select_entry;
  string __str;
  string __str_1;
  ulong local_e0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_d8;
  undefined1 local_d0 [8];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_c8;
  element_type *local_c0;
  Value local_b8;
  BindResult *local_78;
  undefined1 local_70 [24];
  idx_t iStack_58;
  
  this_00 = &this->used_aliases;
  local_e0 = entry;
  iVar10 = ::std::
           _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::find(&this_00->_M_h,&local_e0);
  if (iVar10.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
    pSVar2 = this->node;
    if ((ulong)((long)(pSVar2->select_list).
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pSVar2->select_list).
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= local_e0) {
      this_03 = (BinderException *)__cxa_allocate_exception(0x10);
      local_b8.type_._0_8_ =
           &local_b8.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"GROUP BY term out of range - should be between 1 and %d","");
      BinderException::BinderException<int>
                (this_03,(string *)&local_b8,
                 (int)((ulong)((long)(this->node->select_list).
                                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->node->select_list).
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3));
      __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar11 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](&pSVar2->select_list,local_e0);
    pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(pvVar11);
    (*(pPVar12->super_BaseExpression)._vptr_BaseExpression[0xc])
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8,pPVar12);
    uVar8 = local_b8.type_._0_8_;
    local_b8.type_._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var14._M_head_impl =
         (this->unbound_expression).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (this->unbound_expression).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)uVar8;
    if (_Var14._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var14._M_head_impl)->super_BaseExpression + 8))();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.type_._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(*(_func_int ***)local_b8.type_._0_8_)[1])();
      }
    }
    pvVar11 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](&this->node->select_list,local_e0);
    local_c0 = (element_type *)
               (pvVar11->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pvVar11->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    ExpressionBinder::Bind
              ((ExpressionBinder *)local_d0,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)this,(LogicalType *)&local_c0,false);
    uVar7 = local_e0;
    cVar16 = '\x01';
    if (9 < local_e0) {
      uVar15 = local_e0;
      cVar9 = '\x04';
      do {
        cVar16 = cVar9;
        if (uVar15 < 100) {
          cVar16 = cVar16 + -2;
          goto LAB_00dee3cd;
        }
        if (uVar15 < 1000) {
          cVar16 = cVar16 + -1;
          goto LAB_00dee3cd;
        }
        if (uVar15 < 10000) goto LAB_00dee3cd;
        bVar5 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar9 = cVar16 + '\x04';
      } while (bVar5);
      cVar16 = cVar16 + '\x01';
    }
LAB_00dee3cd:
    mVar3 = this->bind_index;
    this_01 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)this->group_alias_map;
    local_b8.type_._0_8_ =
         &local_b8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_78 = __return_storage_ptr__;
    ::std::__cxx11::string::_M_construct((ulong)&local_b8,cVar16);
    ::std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_b8.type_._0_8_,
               (uint)local_b8.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               uVar7);
    pmVar13 = ::std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[](this_01,(key_type *)&local_b8);
    *pmVar13 = mVar3;
    p_Var6 = &local_b8.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_b8.type_._0_8_ != p_Var6) {
      operator_delete((void *)local_b8.type_._0_8_);
    }
    uVar7 = local_e0;
    cVar16 = '\x01';
    if (9 < local_e0) {
      uVar15 = local_e0;
      cVar9 = '\x04';
      do {
        cVar16 = cVar9;
        if (uVar15 < 100) {
          cVar16 = cVar16 + -2;
          goto LAB_00dee489;
        }
        if (uVar15 < 1000) {
          cVar16 = cVar16 + -1;
          goto LAB_00dee489;
        }
        if (uVar15 < 10000) goto LAB_00dee489;
        bVar5 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar9 = cVar16 + '\x04';
      } while (bVar5);
      cVar16 = cVar16 + '\x01';
    }
LAB_00dee489:
    pBVar1 = (pointer)(local_70 + 0x10);
    local_70._0_8_ = pBVar1;
    ::std::__cxx11::string::_M_construct((ulong)local_70,cVar16);
    ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70._0_8_,local_70._8_4_,uVar7);
    _Var14._M_head_impl = (ParsedExpression *)operator_new(0x50);
    if ((pointer)local_70._0_8_ == pBVar1) {
      local_b8._24_8_ = iStack_58;
      local_b8.type_._0_8_ = p_Var6;
    }
    else {
      local_b8.type_.id_ = local_70[0];
      local_b8.type_.physical_type_ = local_70[1];
      local_b8.type_._2_6_ = local_70._2_6_;
    }
    local_b8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_70._8_8_;
    local_70._8_8_ = (element_type *)0x0;
    local_70[0x10] = 0;
    local_70._0_8_ = pBVar1;
    ColumnRefExpression::ColumnRefExpression
              ((ColumnRefExpression *)_Var14._M_head_impl,(string *)&local_b8);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_b8.type_._0_8_ != p_Var6) {
      operator_delete((void *)local_b8.type_._0_8_);
    }
    pvVar11 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](&this->node->select_list,local_e0);
    _Var4._M_head_impl =
         (pvVar11->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pvVar11->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var14._M_head_impl;
    if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((pointer)local_70._0_8_ != pBVar1) {
      operator_delete((void *)local_70._0_8_);
    }
    local_b8.type_._0_8_ = this_00;
    ::std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this_00,&local_e0);
    __return_storage_ptr__ = local_78;
    local_d8._M_head_impl = (Expression *)local_d0;
    local_d0 = (undefined1  [8])0x0;
    BindResult::BindResult
              (local_78,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&local_d8);
    if (local_d8._M_head_impl != (Expression *)0x0) {
      (*((local_d8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_d8._M_head_impl = (Expression *)0x0;
    if (local_d0 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_d0 + 8))();
    }
    if (local_c0 != (element_type *)0x0) {
      (*((BaseExpression *)&local_c0->_vptr_ExtraTypeInfo)->_vptr_BaseExpression[1])();
    }
  }
  else {
    Value::INTEGER((Value *)local_70,0x2a);
    this_02 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value(&local_b8,(Value *)local_70);
    BoundConstantExpression::BoundConstantExpression(this_02,&local_b8);
    Value::~Value(&local_b8);
    local_c8._M_head_impl = (Expression *)this_02;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_c8);
    if ((BoundConstantExpression *)local_c8._M_head_impl != (BoundConstantExpression *)0x0) {
      (*(((Expression *)&(local_c8._M_head_impl)->super_BaseExpression)->super_BaseExpression).
        _vptr_BaseExpression[1])();
    }
    local_c8._M_head_impl = (Expression *)0x0;
    Value::~Value((Value *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult GroupBinder::BindSelectRef(idx_t entry) {
	if (used_aliases.find(entry) != used_aliases.end()) {
		// the alias has already been bound to before!
		// this happens if we group on the same alias twice
		// e.g. GROUP BY k, k or GROUP BY 1, 1
		// in this case, we can just replace the grouping with a constant since the second grouping has no effect
		// (the constant grouping will be optimized out later)
		return BindResult(make_uniq<BoundConstantExpression>(Value::INTEGER(42)));
	}
	if (entry >= node.select_list.size()) {
		throw BinderException("GROUP BY term out of range - should be between 1 and %d", (int)node.select_list.size());
	}
	// we replace the root expression, also replace the unbound expression
	unbound_expression = node.select_list[entry]->Copy();
	// move the expression that this refers to here and bind it
	auto select_entry = std::move(node.select_list[entry]);
	auto binding = Bind(select_entry, nullptr, false);
	// now replace the original expression in the select list with a reference to this group
	group_alias_map[to_string(entry)] = bind_index;
	node.select_list[entry] = make_uniq<ColumnRefExpression>(to_string(entry));
	// insert into the set of used aliases
	used_aliases.insert(entry);
	return BindResult(std::move(binding));
}